

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::FinalizeFuncInfos(ByteCodeGenerator *this)

{
  Type TVar1;
  ParseableFunctionInfo *pPVar2;
  FunctionInfo *pFVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *ppFVar7;
  undefined1 local_40 [8];
  Iterator __iter;
  
  local_40 = (undefined1  [8])this->funcInfosToFinalize;
  if (local_40 != (undefined1  [8])0x0) {
    __iter.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (__iter.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_0082e89e;
        *puVar6 = 0;
      }
      __iter.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])__iter.list == local_40) break;
      ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_40);
      if (((*ppFVar7)->field_0xb4 & 1) != 0) {
        pPVar2 = (*ppFVar7)->byteCodeFunction;
        if ((pPVar2->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar5) goto LAB_0082e89e;
          *puVar6 = 0;
        }
        if ((ParseableFunctionInfo *)
            (((pPVar2->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar5) goto LAB_0082e89e;
          *puVar6 = 0;
        }
        pFVar3 = (pPVar2->super_FunctionProxy).functionInfo.ptr;
        TVar1 = pFVar3->attributes;
        if (pFVar3 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x54c,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar5) goto LAB_0082e89e;
          *puVar6 = 0;
        }
        if ((ParseableFunctionInfo *)
            (((pPVar2->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar5) {
LAB_0082e89e:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar6 = 0;
        }
        ((pPVar2->super_FunctionProxy).functionInfo.ptr)->attributes = TVar1 | CanDefer;
      }
    }
    this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeFuncInfos()
{
    if (this->funcInfosToFinalize == nullptr)
    {
        return;
    }

    FOREACH_SLIST_ENTRY(FuncInfo*, funcInfo, this->funcInfosToFinalize)
    {
        if (funcInfo->canDefer)
        {
            funcInfo->byteCodeFunction->SetAttributes((Js::FunctionInfo::Attributes)(funcInfo->byteCodeFunction->GetAttributes() | Js::FunctionInfo::Attributes::CanDefer));
        }
    }
    NEXT_SLIST_ENTRY;

    this->funcInfosToFinalize = nullptr;
}